

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<wchar_t*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<wchar_t*,void> *this,wchar_t *str)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *e;
  allocator<char> local_4d [20];
  allocator<wchar_t> local_39;
  wstring local_38 [32];
  StringMaker<wchar_t*,void> *local_18;
  wchar_t *str_local;
  
  local_18 = this;
  str_local = (wchar_t *)__return_storage_ptr__;
  if (this == (StringMaker<wchar_t*,void> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{null string}",local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_38,(wchar_t *)this,&local_39);
    Detail::stringify<std::__cxx11::wstring>(__return_storage_ptr__,(Detail *)local_38,e);
    std::__cxx11::wstring::~wstring(local_38);
    std::allocator<wchar_t>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<wchar_t *>::convert(wchar_t * str) {
    if (str) {
        return ::Catch::Detail::stringify(std::wstring{ str });
    } else {
        return{ "{null string}" };
    }
}